

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOperatorTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles3::Performance::lineParamsString_abi_cxx11_
          (string *__return_storage_ptr__,Performance *this,LineParameters *params)

{
  string sStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  de::toString<float>(&local_38,(float *)this);
  std::operator+(&local_98,"y = ",&local_38);
  std::operator+(&local_78,&local_98," + ");
  de::toString<float>(&sStack_b8,(float *)(this + 4));
  std::operator+(&local_58,&local_78,&sStack_b8);
  std::operator+(__return_storage_ptr__,&local_58,"*x");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&sStack_b8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

static string lineParamsString (const LineParameters& params)
{
	return "y = " + de::toString(params.offset) + " + " + de::toString(params.coefficient) + "*x";
}